

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void PIT_CeilingLower(AActor *thing,FChangePosition *cpos)

{
  double oldz;
  double dVar1;
  player_t *ppVar2;
  int iVar3;
  ulong uVar4;
  double dVar5;
  
  oldz = (thing->__Pos).Z;
  dVar1 = thing->floorz;
  P_AdjustFloorCeil(thing,cpos);
  if (thing->ceilingz < (thing->__Pos).Z + thing->Height) {
    if (((thing->flags4).Value & 0x80) != 0) {
      cpos->nofit = true;
      return;
    }
    if (intersectors.Count != 0) {
      intersectors.Count = 0;
    }
    dVar5 = thing->ceilingz - thing->Height;
    uVar4 = -(ulong)(thing->floorz <= dVar5);
    (thing->__Pos).Z = (double)(~uVar4 & (ulong)thing->floorz | (ulong)dVar5 & uVar4);
    AActor::UpdateRenderSectorList(thing);
    iVar3 = P_PushDown(thing,cpos);
    if (iVar3 - 1U < 2) {
      if (oldz <= dVar1) {
        (thing->__Pos).Z = thing->floorz;
      }
      P_DoCrunch(thing,cpos);
    }
    P_CheckFakeFloorTriggers(thing,oldz,false);
    AActor::UpdateRenderSectorList(thing);
  }
  ppVar2 = thing->player;
  if ((ppVar2 != (player_t *)0x0) && (ppVar2->mo == (APlayerPawn *)thing)) {
    ppVar2->viewz = ((thing->__Pos).Z - oldz) + ppVar2->viewz;
  }
  return;
}

Assistant:

void PIT_CeilingLower(AActor *thing, FChangePosition *cpos)
{
	bool onfloor;
	double oldz = thing->Z();

	onfloor = thing->Z() <= thing->floorz;
	P_AdjustFloorCeil(thing, cpos);

	if (thing->Top() > thing->ceilingz)
	{
		if (thing->flags4 & MF4_ACTLIKEBRIDGE)
		{
			cpos->nofit = true;
			return; // do not move bridge things
		}
		intersectors.Clear();
		if (thing->ceilingz - thing->Height >= thing->floorz)
		{
			thing->SetZ(thing->ceilingz - thing->Height);
		}
		else
		{
			thing->SetZ(thing->floorz);
		}
		thing->UpdateRenderSectorList();
		switch (P_PushDown(thing, cpos))
		{
		case 2:
			// intentional fall-through
		case 1:
			if (onfloor)
				thing->SetZ(thing->floorz);
			P_DoCrunch(thing, cpos);
			P_CheckFakeFloorTriggers(thing, oldz);
			thing->UpdateRenderSectorList();
			break;
		default:
			P_CheckFakeFloorTriggers(thing, oldz);
			thing->UpdateRenderSectorList();
			break;
		}
	}
	if (thing->player && thing->player->mo == thing)
	{
		thing->player->viewz += thing->Z() - oldz;
	}
}